

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedMap.c
# Opt level: O3

void * rmlLinkedMapRemove(void *self,char *key)

{
  void *item;
  rmlLinkedMapKeyValuePair_ *self_00;
  void *pvVar1;
  char *local_30;
  undefined8 local_28;
  void *pvStack_20;
  
  local_28 = 0;
  pvStack_20 = (void *)0x0;
  local_30 = key;
  rmlLinkedListEach(self,rmlLinkedMapGetPairItemEachCallback,&local_30);
  item = pvStack_20;
  self_00 = (rmlLinkedMapKeyValuePair_ *)rmlLinkedListItemGetValue(pvStack_20);
  if (self_00 == (rmlLinkedMapKeyValuePair_ *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = self_00->value;
    rmlLinkedMapKeyValuePairDestroy(self_00);
  }
  rmlLinkedListRemoveItem(self,item);
  return pvVar1;
}

Assistant:

void *rmlLinkedMapRemove(void *self, char *key) {
    void *item = rmlLinkedMapGetPairItem(self, key);
    struct rmlLinkedMapKeyValuePair_ *pair = rmlLinkedListItemGetValue(item);

    void *value = pair != NULL ? pair->value : NULL;

    rmlLinkedMapKeyValuePairDestroy(pair);
    rmlLinkedListRemoveItem(self, item);
    return value;
}